

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-(TPZFMatrix<Fad<float>_> *this,Fad<float> *val)

{
  TPZFMatrix<Fad<float>_> *in_RDX;
  TPZFMatrix<Fad<float>_> *in_RDI;
  TPZFMatrix<Fad<float>_> *pTVar1;
  FadExpr<FadUnaryMin<Fad<float>_>_> *in_stack_ffffffffffffffc8;
  Fad<float> *in_stack_ffffffffffffffd0;
  Fad<float> *in_stack_ffffffffffffffe0;
  
  pTVar1 = in_RDI;
  Fad<float>::operator-((Fad<float> *)in_RDI);
  Fad<float>::Fad<FadUnaryMin<Fad<float>>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  operator+(in_RDX,in_stack_ffffffffffffffe0);
  Fad<float>::~Fad((Fad<float> *)in_RDI);
  FadExpr<FadUnaryMin<Fad<float>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<float>_>_> *)0x127f1df);
  return pTVar1;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator-  (const TVar val ) const {
    return operator+( -val );
}